

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::showEncryption(QPDFJob *this,QPDF *pdf)

{
  undefined8 this_00;
  bool bVar1;
  Pipeline *pPVar2;
  char *pcVar3;
  char *pcVar4;
  encryption_method_e file_method;
  encryption_method_e string_method;
  encryption_method_e stream_method;
  int V;
  int P;
  int R;
  string user_password;
  string encryption_key;
  encryption_method_e local_1a8;
  encryption_method_e local_1a4;
  encryption_method_e local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [32];
  string local_50;
  
  local_194 = 0;
  local_198 = 0;
  local_19c = 0;
  local_1a0 = e_unknown;
  local_1a4 = e_unknown;
  local_1a8 = e_unknown;
  QPDFLogger::getInfo((QPDFLogger *)local_70,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  this_00 = local_70._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  bVar1 = QPDF::isEncrypted(pdf,&local_194,&local_198,&local_19c,&local_1a0,&local_1a4,&local_1a8);
  if (bVar1) {
    pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"R = ");
    pPVar2 = Pipeline::operator<<(pPVar2,local_194);
    Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"P = ");
    pPVar2 = Pipeline::operator<<(pPVar2,local_198);
    Pipeline::operator<<(pPVar2,"\n");
    QPDF::getTrimmedUserPassword_abi_cxx11_((string *)local_70,pdf);
    QPDF::getEncryptionKey_abi_cxx11_(&local_50,pdf);
    pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"User password = ");
    pPVar2 = Pipeline::operator<<(pPVar2,(string *)local_70);
    Pipeline::operator<<(pPVar2,"\n");
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        show_encryption_key == true) {
      pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"Encryption key = ");
      QUtil::hex_encode(&local_190,&local_50);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_190);
      Pipeline::operator<<(pPVar2,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = QPDF::ownerPasswordMatched(pdf);
    if (bVar1) {
      Pipeline::operator<<((Pipeline *)this_00,"Supplied password is owner password\n");
    }
    bVar1 = QPDF::userPasswordMatched(pdf);
    if (bVar1) {
      Pipeline::operator<<((Pipeline *)this_00,"Supplied password is user password\n");
    }
    pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"extract for accessibility: ");
    bVar1 = QPDF::allowAccessibility(pdf);
    pcVar4 = "not allowed";
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_190);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"extract for any purpose: ");
    bVar1 = QPDF::allowExtractAll(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_150);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"print low resolution: ");
    bVar1 = QPDF::allowPrintLowRes(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_170);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"print high resolution: ");
    bVar1 = QPDF::allowPrintHighRes(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_d0);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify document assembly: ");
    bVar1 = QPDF::allowModifyAssembly(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_f0);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify forms: ");
    bVar1 = QPDF::allowModifyForm(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_110);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify annotations: ");
    bVar1 = QPDF::allowModifyAnnotation(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_130);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify other: ");
    bVar1 = QPDF::allowModifyOther(pdf);
    pcVar3 = "not allowed";
    if (bVar1) {
      pcVar3 = "allowed";
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar3,pcVar3 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_90);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify anything: ");
    bVar1 = QPDF::allowModifyAll(pdf);
    if (bVar1) {
      pcVar4 = "allowed";
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,pcVar4,pcVar4 + (ulong)!bVar1 * 4 + 7);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_b0);
    Pipeline::operator<<(pPVar2,"\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (3 < local_19c) {
      pPVar2 = Pipeline::operator<<((Pipeline *)this_00,"stream encryption method: ");
      show_encryption_method_abi_cxx11_(&local_190,local_1a0);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_190);
      pPVar2 = Pipeline::operator<<(pPVar2,"\n");
      pPVar2 = Pipeline::operator<<(pPVar2,"string encryption method: ");
      show_encryption_method_abi_cxx11_(&local_150,local_1a4);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_150);
      pPVar2 = Pipeline::operator<<(pPVar2,"\n");
      pPVar2 = Pipeline::operator<<(pPVar2,"file encryption method: ");
      show_encryption_method_abi_cxx11_(&local_170,local_1a8);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_170);
      Pipeline::operator<<(pPVar2,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  else {
    Pipeline::operator<<((Pipeline *)this_00,"File is not encrypted\n");
  }
  return;
}

Assistant:

void
QPDFJob::showEncryption(QPDF& pdf)
{
    // Extract /P from /Encrypt
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_unknown;
    QPDF::encryption_method_e string_method = QPDF::e_unknown;
    QPDF::encryption_method_e file_method = QPDF::e_unknown;
    auto& cout = *m->log->getInfo();
    if (!pdf.isEncrypted(R, P, V, stream_method, string_method, file_method)) {
        cout << "File is not encrypted\n";
    } else {
        cout << "R = " << R << "\n";
        cout << "P = " << P << "\n";
        std::string user_password = pdf.getTrimmedUserPassword();
        std::string encryption_key = pdf.getEncryptionKey();
        cout << "User password = " << user_password << "\n";
        if (m->show_encryption_key) {
            cout << "Encryption key = " << QUtil::hex_encode(encryption_key) << "\n";
        }
        if (pdf.ownerPasswordMatched()) {
            cout << "Supplied password is owner password\n";
        }
        if (pdf.userPasswordMatched()) {
            cout << "Supplied password is user password\n";
        }
        cout << "extract for accessibility: " << show_bool(pdf.allowAccessibility()) << "\n"
             << "extract for any purpose: " << show_bool(pdf.allowExtractAll()) << "\n"
             << "print low resolution: " << show_bool(pdf.allowPrintLowRes()) << "\n"
             << "print high resolution: " << show_bool(pdf.allowPrintHighRes()) << "\n"
             << "modify document assembly: " << show_bool(pdf.allowModifyAssembly()) << "\n"
             << "modify forms: " << show_bool(pdf.allowModifyForm()) << "\n"
             << "modify annotations: " << show_bool(pdf.allowModifyAnnotation()) << "\n"
             << "modify other: " << show_bool(pdf.allowModifyOther()) << "\n"
             << "modify anything: " << show_bool(pdf.allowModifyAll()) << "\n";
        if (V >= 4) {
            cout << "stream encryption method: " << show_encryption_method(stream_method) << "\n"
                 << "string encryption method: " << show_encryption_method(string_method) << "\n"
                 << "file encryption method: " << show_encryption_method(file_method) << "\n";
        }
    }
}